

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.h
# Opt level: O0

void __thiscall Liby::WeakTimerHolder::~WeakTimerHolder(WeakTimerHolder *this)

{
  WeakTimerHolder *this_local;
  
  std::weak_ptr<Liby::Timer>::~weak_ptr(&this->weakTimerPtr_);
  Timer::~Timer(&this->timer_);
  return;
}

Assistant:

WeakTimerHolder(const TimerHolder &holder)
        : timer_(holder.getTimer().id(), holder.getTimer().timeout(), nullptr),
          weakTimerPtr_(holder.getTimerPtr()) {}